

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O1

char * linenoiseNoTTY(void)

{
  int iVar1;
  char *__ptr;
  size_t __size;
  size_t sVar2;
  char *__ptr_00;
  char *unaff_R15;
  bool bVar3;
  
  sVar2 = 0;
  __size = 0;
  __ptr_00 = (char *)0x0;
  do {
    __ptr = __ptr_00;
    if (sVar2 == __size) {
      bVar3 = __size == 0;
      __size = __size * 2;
      if (bVar3) {
        __size = 0x20;
      }
      __ptr = (char *)realloc(__ptr_00,__size);
      if (__ptr == (char *)0x0) {
        if (__ptr_00 != (char *)0x0) {
          free(__ptr_00);
        }
        unaff_R15 = (char *)0x0;
      }
      if (__ptr == (char *)0x0) {
        return unaff_R15;
      }
    }
    iVar1 = fgetc(_stdin);
    if ((iVar1 == 10) || (iVar1 == -1)) {
      if (sVar2 == 0 && iVar1 == -1) {
        free(__ptr);
        sVar2 = 0;
        unaff_R15 = (char *)0x0;
      }
      else {
        __ptr[sVar2] = '\0';
        unaff_R15 = __ptr;
      }
    }
    else {
      __ptr[sVar2] = (char)iVar1;
      sVar2 = sVar2 + 1;
    }
    if (iVar1 == 10) {
      return unaff_R15;
    }
    __ptr_00 = __ptr;
    if (iVar1 == -1) {
      return unaff_R15;
    }
  } while( true );
}

Assistant:

static char *linenoiseNoTTY(void) {
    char *line = NULL;
    size_t len = 0, maxlen = 0;

    while(1) {
        if (len == maxlen) {
            if (maxlen == 0) maxlen = 16;
            maxlen *= 2;
            char *oldval = line;
            line = realloc(line,maxlen);
            if (line == NULL) {
                if (oldval) free(oldval);
                return NULL;
            }
        }
        int c = fgetc(stdin);
        if (c == EOF || c == '\n') {
            if (c == EOF && len == 0) {
                free(line);
                return NULL;
            } else {
                line[len] = '\0';
                return line;
            }
        } else {
            line[len] = c;
            len++;
        }
    }
}